

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnRetime.c
# Opt level: O1

int Wln_RetCheckBackward(Wln_Ret_t *p,Vec_Int_t *vSet)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  uint uVar5;
  Wln_Ntk_t *pWVar6;
  int *piVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  
  if (0 < vSet->nSize) {
    lVar11 = 0;
    do {
      iVar1 = vSet->pArray[lVar11];
      lVar12 = (long)iVar1;
      if ((lVar12 < 0) || (pWVar6 = p->pNtk, (pWVar6->vRefs).nSize <= iVar1)) {
LAB_0038ac34:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if ((pWVar6->vRefs).pArray[lVar12] == 0) {
        return 0;
      }
      iVar9 = -1;
      lVar10 = 0;
      while (lVar10 < (pWVar6->vRefs).pArray[lVar12]) {
        iVar2 = (p->vFanouts).nSize;
        if (iVar2 <= iVar1) goto LAB_0038ac34;
        piVar7 = (p->vFanouts).pArray;
        lVar8 = (long)piVar7[lVar12];
        if ((lVar8 < 0) || (iVar2 <= piVar7[lVar12])) {
LAB_0038ac53:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
        }
        iVar2 = piVar7[lVar8 + lVar10 * 2 + 1];
        if (((long)iVar2 < 0) || ((p->vFanins).nSize <= iVar2)) goto LAB_0038ac53;
        piVar4 = (p->vFanins).pArray;
        if (piVar4 == (int *)0x0) break;
        if (piVar7[lVar8 + lVar10 * 2] != 0) {
          piVar4 = piVar4 + iVar2;
          if (*piVar4 == 0) {
            return 0;
          }
          piVar7 = Wln_RetHeadToTail(p,piVar4);
          if ((*piVar7 < -1) || (uVar5 = *piVar7 + 1, (p->vEdgeLinks).nSize <= (int)uVar5))
          goto LAB_0038ac34;
          iVar2 = (p->vEdgeLinks).pArray[uVar5];
          lVar8 = (long)iVar2;
          if ((lVar8 < 0) || ((p->pNtk->vTypes).nSize <= iVar2)) goto LAB_0038ac34;
          if ((p->pNtk->vTypes).pArray[lVar8] != 0x59) {
            __assert_fail("Wln_ObjIsFf( p->pNtk, iFlop )",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wln/wlnRetime.c"
                          ,0x18b,"int Wln_RetCheckBackwardOne(Wln_Ret_t *, int)");
          }
          iVar3 = (p->vFfClasses).nSize;
          if (iVar9 == -1) {
            if (iVar3 <= iVar2) goto LAB_0038ac34;
            iVar9 = (p->vFfClasses).pArray[lVar8];
          }
          else {
            if (iVar3 <= iVar2) goto LAB_0038ac34;
            if (iVar9 != (p->vFfClasses).pArray[lVar8]) {
              return 0;
            }
          }
        }
        lVar10 = lVar10 + 1;
        pWVar6 = p->pNtk;
        if ((pWVar6->vRefs).nSize <= iVar1) goto LAB_0038ac34;
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < vSet->nSize);
  }
  return 1;
}

Assistant:

int Wln_RetCheckBackward( Wln_Ret_t * p, Vec_Int_t * vSet )
{
    int i, iObj;
    Vec_IntForEachEntry( vSet, iObj, i )
        if ( !Wln_RetCheckBackwardOne( p, iObj ) )
            return 0;
    return 1;
}